

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::upper_bound(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *this,key_type *key)

{
  iterator checker_iter;
  iterator iVar1;
  iterator iVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  bVar2;
  
  iVar1 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
          ::upper_bound<long>((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                               *)this,key);
  checker_iter = std::
                 _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                 ::upper_bound(&(this->checker_)._M_t,key);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                *)SUB128(iVar1._0_12_,0);
  bVar2.position = SUB124(iVar1._0_12_,8);
  bVar2 = base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>,std::pair<long_const,long>&,std::pair<long_const,long>*>,std::_Rb_tree_iterator<std::pair<long_const,long>>>
                    ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                      *)this,bVar2,
                     (_Rb_tree_iterator<std::pair<const_long,_long>_>)checker_iter._M_node);
  iVar3.node = bVar2.node;
  iVar3.position = bVar2.position;
  iVar3._12_4_ = bVar2._12_4_;
  return iVar3;
}

Assistant:

iterator upper_bound(const key_type &key) {
        return iter_check(tree_.upper_bound(key), checker_.upper_bound(key));
    }